

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgproperty.cpp
# Opt level: O3

PropertyID lunasvg::csspropertyid(string_view *name)

{
  ulong __n;
  char *__s2;
  PropertyID PVar1;
  int iVar2;
  ulong __n_00;
  difference_type __d;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  anon_struct_24_2_b8fd76e8 *paVar6;
  
  __n = name->_M_len;
  __s2 = name->_M_str;
  paVar6 = csspropertyid::table;
  uVar4 = 0x23;
  do {
    uVar3 = uVar4 >> 1;
    __n_00 = paVar6[uVar3].name._M_len;
    lVar5 = __n_00 - __n;
    if (__n <= __n_00) {
      __n_00 = __n;
    }
    if (__n_00 == 0) {
LAB_0011f00a:
      if (lVar5 < -0x7fffffff) {
        lVar5 = -0x80000000;
      }
      if (0x7ffffffe < lVar5) {
        lVar5 = 0x7fffffff;
      }
      iVar2 = (int)lVar5;
    }
    else {
      iVar2 = memcmp(paVar6[uVar3].name._M_str,__s2,__n_00);
      if (iVar2 == 0) goto LAB_0011f00a;
    }
    if (iVar2 < 0) {
      paVar6 = paVar6 + uVar3 + 1;
      uVar3 = ~uVar3 + uVar4;
    }
    uVar4 = uVar3;
  } while (0 < (long)uVar3);
  if ((paVar6 == (anon_struct_24_2_b8fd76e8 *)&DAT_0015acb8) || ((paVar6->name)._M_len != __n)) {
LAB_0011f070:
    PVar1 = Unknown;
  }
  else {
    if (__n != 0) {
      iVar2 = bcmp((paVar6->name)._M_str,__s2,__n);
      if (iVar2 != 0) goto LAB_0011f070;
    }
    PVar1 = paVar6->value;
  }
  return PVar1;
}

Assistant:

PropertyID csspropertyid(const std::string_view& name)
{
    static const struct {
        std::string_view name;
        PropertyID value;
    } table[] = {
        {"alignment-baseline", PropertyID::Alignment_Baseline},
        {"baseline-shift", PropertyID::Baseline_Shift},
        {"clip-path", PropertyID::Clip_Path},
        {"clip-rule", PropertyID::Clip_Rule},
        {"color", PropertyID::Color},
        {"direction", PropertyID::Direction},
        {"display", PropertyID::Display},
        {"dominant-baseline", PropertyID::Dominant_Baseline},
        {"fill", PropertyID::Fill},
        {"fill-opacity", PropertyID::Fill_Opacity},
        {"fill-rule", PropertyID::Fill_Rule},
        {"font-family", PropertyID::Font_Family},
        {"font-size", PropertyID::Font_Size},
        {"font-style", PropertyID::Font_Style},
        {"font-weight", PropertyID::Font_Weight},
        {"marker-end", PropertyID::Marker_End},
        {"marker-mid", PropertyID::Marker_Mid},
        {"marker-start", PropertyID::Marker_Start},
        {"mask", PropertyID::Mask},
        {"mask-type", PropertyID::Mask_Type},
        {"opacity", PropertyID::Opacity},
        {"overflow", PropertyID::Overflow},
        {"stop-color", PropertyID::Stop_Color},
        {"stop-opacity", PropertyID::Stop_Opacity},
        {"stroke", PropertyID::Stroke},
        {"stroke-dasharray", PropertyID::Stroke_Dasharray},
        {"stroke-dashoffset", PropertyID::Stroke_Dashoffset},
        {"stroke-linecap", PropertyID::Stroke_Linecap},
        {"stroke-linejoin", PropertyID::Stroke_Linejoin},
        {"stroke-miterlimit", PropertyID::Stroke_Miterlimit},
        {"stroke-opacity", PropertyID::Stroke_Opacity},
        {"stroke-width", PropertyID::Stroke_Width},
        {"text-anchor", PropertyID::Text_Anchor},
        {"visibility", PropertyID::Visibility},
        {"white-space", PropertyID::WhiteSpace}
    };

    auto it = std::lower_bound(table, std::end(table), name, [](const auto& item, const auto& name) { return item.name < name; });
    if(it == std::end(table) || it->name != name)
        return PropertyID::Unknown;
    return it->value;
}